

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enemy.cpp
# Opt level: O3

void __thiscall
Enemy::update(Enemy *this,int width,Paddle *paddle,vector<Brick,_std::allocator<Brick>_> *bricks,
             Character *character,int currentTimeInMillis,bool winOrLose)

{
  float *pfVar1;
  anon_struct_8_2_947311e6_for_anon_union_8_4_ea85571f_for_vec<2,_float,_(glm::qualifier)0>_3_0
  aVar2;
  pointer pBVar3;
  anon_union_8_4_ea85571f_for_vec<2,_float,_(glm::qualifier)0>_3 aVar4;
  bool bVar5;
  Brick *brick;
  pointer other;
  float fVar6;
  float fVar7;
  vec2 vVar8;
  anon_union_8_4_ea85571f_for_vec<2,_float,_(glm::qualifier)0>_3 aVar9;
  float fVar10;
  
  if (this->state == DEAD) {
    return;
  }
  fVar6 = (this->super_AABB).center.field_0.field_0.x;
  if ((fVar6 <= 32.0) || ((float)width + -32.0 <= fVar6)) {
    fVar7 = 0.0;
  }
  else {
    fVar7 = 0.2;
  }
  aVar2 = (this->velocity).field_0.field_0;
  fVar10 = aVar2.x;
  aVar9._0_4_ = fVar10 + 0.0;
  aVar9._4_4_ = fVar7 + aVar2.y;
  (this->velocity).field_0 = aVar9;
  fVar7 = -1.0;
  if ((fVar10 < -1.0) || (fVar7 = 1.0, 1.0 < fVar10)) {
    aVar9._0_4_ = fVar7;
    (this->velocity).field_0.field_0.x = aVar9._0_4_;
  }
  fVar7 = -4.0;
  if ((aVar9._4_4_ < -4.0) || (fVar7 = 4.0, fVar10 = aVar9._4_4_, 4.0 < aVar9._4_4_)) {
    (this->velocity).field_0.field_0.y = fVar7;
    fVar10 = fVar7;
  }
  aVar4.field_0.y = (this->super_AABB).center.field_0.field_0.y + fVar10;
  aVar4.field_0.x = aVar9._0_4_ + fVar6;
  (this->super_AABB).center.field_0 = aVar4;
  fVar6 = AABB::getTop(&this->super_AABB);
  pfVar1 = &(this->startPos).field_0.field_0.y;
  if (*pfVar1 <= fVar6 && fVar6 != *pfVar1) {
    fVar6 = AABB::getLeft(&this->super_AABB);
    if (32.0 <= fVar6) {
      fVar6 = AABB::getRight(&this->super_AABB);
      if (fVar6 <= (float)width + -32.0) goto LAB_0012e546;
      fVar6 = (((float)width + -32.0) - (this->super_AABB).halfDimension.field_0.field_0.x) + -1.0;
    }
    else {
      fVar6 = (this->super_AABB).halfDimension.field_0.field_0.x + 32.0 + 1.0;
    }
    (this->super_AABB).center.field_0.field_0.x = fVar6;
    (this->velocity).field_0.field_0.x = -(this->velocity).field_0.field_0.x;
  }
LAB_0012e546:
  other = (bricks->super__Vector_base<Brick,_std::allocator<Brick>_>)._M_impl.
          super__Vector_impl_data._M_start;
  pBVar3 = (bricks->super__Vector_base<Brick,_std::allocator<Brick>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  do {
    if (other == pBVar3) {
      if ((!winOrLose) &&
         (bVar5 = AABB::intersectsAABB(&this->super_AABB,&character->super_AABB), bVar5)) {
        vVar8 = Character::getVelocity(character);
        if ((0.0 < vVar8.field_0._4_4_) &&
           (fVar6 = AABB::getBottom(&character->super_AABB),
           fVar6 < (this->super_AABB).center.field_0.field_0.y)) {
          *(undefined8 *)&this->state = 1;
          this->timeOfDeathInMillis = currentTimeInMillis;
          Character::bounce(character);
          return;
        }
        bVar5 = Character::isInvincible(character);
        if (!bVar5) {
          fVar6 = (this->super_AABB).center.field_0.field_0.x;
          Character::dieByEnemy
                    (character,currentTimeInMillis,
                     *(float *)(&DAT_001724dc +
                               (ulong)((character->super_AABB).center.field_0.field_0.x <= fVar6 &&
                                      fVar6 != (character->super_AABB).center.field_0.field_0.x) * 4
                               ));
          return;
        }
      }
      return;
    }
    bVar5 = AABB::intersectsAABB(&this->super_AABB,&other->super_AABB);
    if (bVar5) {
      fVar7 = AABB::getBottom(&this->super_AABB);
      fVar6 = (other->super_AABB).center.field_0.field_0.y;
      if (fVar7 <= fVar6) {
        (this->super_AABB).center.field_0.field_0.y =
             (fVar6 - (other->super_AABB).halfDimension.field_0.field_0.y) -
             (this->super_AABB).halfDimension.field_0.field_0.y;
        (this->velocity).field_0.field_0.y = 0.0;
      }
      else {
        fVar6 = (this->velocity).field_0.field_0.x;
        if (fVar6 <= 0.0) {
LAB_0012e5e8:
          if (fVar6 < 0.0) {
            fVar6 = AABB::getLeft(&this->super_AABB);
            fVar7 = AABB::getRight(&other->super_AABB);
            if (fVar6 < fVar7) {
              fVar6 = AABB::getRight(&other->super_AABB);
              fVar6 = fVar6 + (this->super_AABB).halfDimension.field_0.field_0.x + 1.0;
              goto LAB_0012e61e;
            }
          }
        }
        else {
          fVar6 = AABB::getRight(&this->super_AABB);
          fVar7 = AABB::getLeft(&other->super_AABB);
          if (fVar6 <= fVar7) {
            fVar6 = (this->velocity).field_0.field_0.x;
            goto LAB_0012e5e8;
          }
          fVar6 = AABB::getLeft(&other->super_AABB);
          fVar6 = (fVar6 - (this->super_AABB).halfDimension.field_0.field_0.x) + -1.0;
LAB_0012e61e:
          (this->super_AABB).center.field_0.field_0.x = fVar6;
          (this->velocity).field_0.field_0.x = -(this->velocity).field_0.field_0.x;
        }
      }
    }
    other = other + 1;
  } while( true );
}

Assistant:

void Enemy::update(int width, Paddle& paddle, std::vector<Brick>& bricks, Character& character, int currentTimeInMillis, bool winOrLose) {
    if (state == DEAD) {
        return;
    }
    glm::vec2 acceleration = (center.x > BRICK_WIDTH && center.x < (width - BRICK_WIDTH)) ? GRAVITY : glm::vec2(0.0f, 0.0f);
    velocity += acceleration;
    if (velocity.x < -ENEMY_MAX_VELOCITY.x) {
        velocity.x = -ENEMY_MAX_VELOCITY.x;
    } else if (velocity.x > ENEMY_MAX_VELOCITY.x) {
        velocity.x = ENEMY_MAX_VELOCITY.x;
    }
    if (velocity.y < -ENEMY_MAX_VELOCITY.y) {
        velocity.y = -ENEMY_MAX_VELOCITY.y;
    } else if (velocity.y > ENEMY_MAX_VELOCITY.y) {
        velocity.y = ENEMY_MAX_VELOCITY.y;
    }
    center += velocity;
    if (getTop() > startPos.y) {
        if (getLeft() < BRICK_WIDTH) {
            center.x = BRICK_WIDTH + halfDimension.x + 1;
            velocity.x *= -1.0f;
        } else if (getRight() > width - BRICK_WIDTH) {
            center.x = width - BRICK_WIDTH - halfDimension.x - 1;
            velocity.x *= -1.0f;
        }
    }
    for (Brick& brick : bricks) {
        if (intersectsAABB(brick)) {
            if (getBottom() > brick.center.y) {
                if (velocity.x > 0.0f && getRight() > brick.getLeft()) {
                    center.x = brick.getLeft() - halfDimension.x - 1;
                    velocity.x *= -1.0f;
                } else if (velocity.x < 0.0f && getLeft() < brick.getRight()) {
                    center.x = brick.getRight() + halfDimension.x + 1;
                    velocity.x *= -1.0f;
                }
            } else {
                center.y = brick.center.y - brick.halfDimension.y - halfDimension.y;
                velocity.y = 0.0f;
            }
        }
    }
    if (!winOrLose) {
        if (intersectsAABB(character)) {
            if (character.getVelocity().y > 0.0 && character.getBottom() < center.y) {
                state = DEAD;
                timeOfDeathInMillis = currentTimeInMillis;
                velocity.x = 0.0f;
                character.bounce();
            } else if (!character.isInvincible()) {
                character.dieByEnemy(currentTimeInMillis, character.center.x < center.x ? -1.0f : 1.0f);
            }
        }
    }
}